

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_if_timer(mg_connection *c,double now)

{
  double dVar1;
  double local_10;
  
  dVar1 = c->ev_timer_time;
  if ((0.0 < dVar1) && (dVar1 <= now)) {
    local_10 = now;
    mg_call(c,(mg_event_handler_t)0x0,6,&local_10);
    if ((c->ev_timer_time == dVar1) && (!NAN(c->ev_timer_time) && !NAN(dVar1))) {
      c->ev_timer_time = 0.0;
    }
  }
  return;
}

Assistant:

void mg_if_timer(struct mg_connection *c, double now) {
    if (c->ev_timer_time > 0 && now >= c->ev_timer_time) {
        double old_value = c->ev_timer_time;
        mg_call(c, NULL, MG_EV_TIMER, &now);
        /*
     * To prevent timer firing all the time, reset the timer after delivery.
     * However, in case user sets it to new value, do not reset.
     */
        if (c->ev_timer_time == old_value) {
            c->ev_timer_time = 0;
        }
    }
}